

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::delete_subtree(basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 *this,db_type *db_instance)

{
  byte bVar1;
  bool bVar2;
  reference this_00;
  basic_node_ptr<unodb::detail::olc_node_header> local_30;
  basic_node_ptr<unodb::detail::olc_node_header> child;
  uint local_20;
  uint i;
  uint actual_children_count;
  uchar children_count_;
  db_type *db_instance_local;
  basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  
  bVar1 = in_critical_section<unsigned_char>::load
                    ((in_critical_section<unsigned_char> *)&this->field_0x20);
  local_20 = 0;
  child.tagged_ptr._4_4_ = 0;
  do {
    if (0x2f < child.tagged_ptr._4_4_) {
      if (local_20 != bVar1) {
        __assert_fail("actual_children_count == children_count_",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x9a9,
                      "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::delete_subtree(db_type &) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                     );
      }
      return;
    }
    this_00 = std::
              array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
              ::operator[](&(this->children).pointer_array,(ulong)child.tagged_ptr._4_4_);
    local_30 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
               load(this_00);
    bVar2 = basic_node_ptr<unodb::detail::olc_node_header>::operator==(&local_30,(nullptr_t)0x0);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
      ::delete_subtree(local_30,db_instance);
      local_20 = local_20 + 1;
      if (bVar1 < local_20) {
        __assert_fail("actual_children_count <= children_count_",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x9a5,
                      "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::delete_subtree(db_type &) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                     );
      }
    }
    child.tagged_ptr._4_4_ = child.tagged_ptr._4_4_ + 1;
  } while( true );
}

Assistant:

constexpr void delete_subtree(db_type &db_instance) noexcept {
#ifndef NDEBUG
    const auto children_count_ = this->children_count.load();
    unsigned actual_children_count = 0;
#endif

    for (unsigned i = 0; i < this->capacity; ++i) {
      const auto child = children.pointer_array[i].load();
      if (child != nullptr) {
        ArtPolicy::delete_subtree(child, db_instance);
#ifndef NDEBUG
        ++actual_children_count;
        UNODB_DETAIL_ASSERT(actual_children_count <= children_count_);
#endif
      }
    }
    UNODB_DETAIL_ASSERT(actual_children_count == children_count_);
  }